

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O1

int number_textbox(mu_Context *ctx,mu_Real *value,mu_Rect r,mu_Id id)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  
  if (((ctx->mouse_pressed == 1) && ((ctx->key_down & 1) != 0)) && (ctx->hover == id)) {
    ctx->number_edit = id;
    sprintf(ctx->number_edit_buf,"%.3g",(double)*value);
  }
  iVar2 = 0;
  if (ctx->number_edit == id) {
    uVar1 = mu_textbox_raw(ctx,ctx->number_edit_buf,0x7f,id,r,0);
    if (((uVar1 & 2) != 0) || (iVar2 = 1, ctx->focus != id)) {
      iVar2 = 0;
      dVar3 = strtod(ctx->number_edit_buf,(char **)0x0);
      *value = (float)dVar3;
      ctx->number_edit = 0;
    }
  }
  return iVar2;
}

Assistant:

static int number_textbox(mu_Context *ctx, mu_Real *value, mu_Rect r, mu_Id id) {
  if (ctx->mouse_pressed == MU_MOUSE_LEFT && ctx->key_down & MU_KEY_SHIFT &&
      ctx->hover == id
  ) {
    ctx->number_edit = id;
    sprintf(ctx->number_edit_buf, MU_REAL_FMT, *value);
  }
  if (ctx->number_edit == id) {
    int res = mu_textbox_raw(
      ctx, ctx->number_edit_buf, sizeof(ctx->number_edit_buf), id, r, 0);
    if (res & MU_RES_SUBMIT || ctx->focus != id) {
      *value = strtod(ctx->number_edit_buf, NULL);
      ctx->number_edit = 0;
    } else {
      return 1;
    }
  }
  return 0;
}